

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O0

void __thiscall
primesum::BinaryIndexedTree::init<primesum::BitSieve>
          (BinaryIndexedTree *this,BitSieve *sieve,int64_t low)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  reference pvVar5;
  ulong *puVar6;
  long in_RDX;
  BitSieve *in_RSI;
  vector<__int128,_std::allocator<__int128>_> *in_RDI;
  int64_t j;
  int64_t k;
  int64_t i2;
  int64_t i;
  ulong in_stack_ffffffffffffff98;
  BitSieve *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  ulong local_38;
  ulong local_30;
  ulong local_20;
  
  sVar2 = BitSieve::size(in_RSI);
  in_RDI[1].super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(sVar2 >> 1);
  std::vector<__int128,_std::allocator<__int128>_>::resize(in_RDI,in_stack_ffffffffffffffb8);
  for (local_20 = 0;
      (long)local_20 <
      (long)in_RDI[1].super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
            super__Vector_impl_data._M_start; local_20 = local_20 + 1) {
    bVar1 = BitSieve::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    lVar3 = (in_RDX + local_20 * 2) * (ulong)bVar1;
    lVar4 = lVar3 >> 0x3f;
    pvVar5 = std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RDI,local_20);
    *(long *)pvVar5 = lVar3;
    *(long *)((long)pvVar5 + 8) = lVar4;
    local_30 = local_20 + 1 & (local_20 ^ 0xffffffffffffffff);
    local_38 = local_20;
    while (local_30 = (long)local_30 >> 1, local_30 != 0) {
      puVar6 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_RDI,local_38 - 1);
      in_stack_ffffffffffffff98 = *puVar6;
      in_stack_ffffffffffffffa0 = (BitSieve *)puVar6[1];
      puVar6 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (in_RDI,local_20);
      puVar6[1] = (long)&(in_stack_ffffffffffffffa0->sieve_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start +
                  (ulong)CARRY8(*puVar6,in_stack_ffffffffffffff98) + puVar6[1];
      *puVar6 = *puVar6 + in_stack_ffffffffffffff98;
      local_38 = local_38 - 1 & local_38;
    }
  }
  return;
}

Assistant:

void init(const T& sieve, int64_t low)
  {
    size_ = sieve.size() / 2;
    tree_.resize(size_);

    for (int64_t i = 0; i < size_; i++)
    {
      int64_t i2 = i * 2;
      tree_[i] = (low + i2) * sieve[i2];
      int64_t k = (i + 1) & ~i;
      for (int64_t j = i; k >>= 1; j &= j - 1)
        tree_[i] += tree_[j - 1];
    }
  }